

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

char ** hts_idx_seqnames(hts_idx_t *idx,int *n,hts_id2name_f getid,void *hdr)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  size_t __nmemb;
  int iVar6;
  
  iVar1 = idx->n;
  __nmemb = (size_t)iVar1;
  iVar6 = 0;
  if (__nmemb == 0) {
    ppcVar2 = (char **)0x0;
  }
  else {
    ppcVar2 = (char **)calloc(__nmemb,8);
    iVar6 = 0;
    if (0 < iVar1) {
      lVar5 = 0;
      iVar6 = 0;
      do {
        if (idx->bidx[lVar5] != (bidx_t *)0x0) {
          pcVar3 = (*getid)(hdr,(int)lVar5);
          lVar4 = (long)iVar6;
          iVar6 = iVar6 + 1;
          ppcVar2[lVar4] = pcVar3;
          __nmemb = (size_t)(uint)idx->n;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)__nmemb);
    }
  }
  *n = iVar6;
  return ppcVar2;
}

Assistant:

const char **hts_idx_seqnames(const hts_idx_t *idx, int *n, hts_id2name_f getid, void *hdr)
{
    if ( !idx->n )
    {
        *n = 0;
        return NULL;
    }

    int tid = 0, i;
    const char **names = (const char**) calloc(idx->n,sizeof(const char*));
    for (i=0; i<idx->n; i++)
    {
        bidx_t *bidx = idx->bidx[i];
        if ( !bidx ) continue;
        names[tid++] = getid(hdr,i);
    }
    *n = tid;
    return names;
}